

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

TreeEnsembleParameters_TreeNode_EvaluationInfo *
google::protobuf::internal::
GenericTypeHandler<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::New
          (Arena *arena)

{
  Arena *arena_local;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *local_28;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (TreeEnsembleParameters_TreeNode_EvaluationInfo *)operator_new(0x28);
    CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::
    TreeEnsembleParameters_TreeNode_EvaluationInfo(local_28);
  }
  else {
    local_28 = (TreeEnsembleParameters_TreeNode_EvaluationInfo *)
               Arena::AllocateAligned
                         (arena,(type_info *)
                                &CoreML::Specification::
                                 TreeEnsembleParameters_TreeNode_EvaluationInfo::typeinfo,0x28);
    CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::
    TreeEnsembleParameters_TreeNode_EvaluationInfo(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                      );
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }